

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>const,_1,1,false>const>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,_1,_0,__1,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>
               *src,assign_op<float,_float> *func)

{
  ActualDstType actualDst;
  assign_op<float,_float> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>
  *src_local;
  Matrix<float,__1,_1,_0,__1,_1> *dst_local;
  
  Assignment<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_1,_false>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}